

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O0

string * __thiscall
cmFindProgramCommand::FindProgram_abi_cxx11_
          (string *__return_storage_ptr__,cmFindProgramCommand *this)

{
  ulong uVar1;
  string local_90;
  string local_70;
  string local_50;
  allocator local_1a;
  undefined1 local_19;
  cmFindProgramCommand *local_18;
  cmFindProgramCommand *this_local;
  string *program;
  
  local_19 = 0;
  local_18 = this;
  this_local = (cmFindProgramCommand *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  if ((((this->super_cmFindBase).super_cmFindCommon.SearchAppBundleFirst & 1U) != 0) ||
     (((this->super_cmFindBase).super_cmFindCommon.SearchAppBundleOnly & 1U) != 0)) {
    FindAppBundle_abi_cxx11_(&local_50,this);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) != 0) &&
     (((this->super_cmFindBase).super_cmFindCommon.SearchAppBundleOnly & 1U) == 0)) {
    FindNormalProgram_abi_cxx11_(&local_70,this);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) != 0) &&
     (((this->super_cmFindBase).super_cmFindCommon.SearchAppBundleLast & 1U) != 0)) {
    FindAppBundle_abi_cxx11_(&local_90,this);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindProgramCommand::FindProgram()
{
  std::string program = "";

  if(this->SearchAppBundleFirst || this->SearchAppBundleOnly)
    {
    program = FindAppBundle();
    }
  if(program.empty() && !this->SearchAppBundleOnly)
    {
    program = this->FindNormalProgram();
    }

  if(program.empty() && this->SearchAppBundleLast)
    {
    program = this->FindAppBundle();
    }
  return program;
}